

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  connectdata *conn_00;
  connectdata *conn;
  _Bool premature_local;
  CURLcode status_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  (data->state).authhost.field_0x18 = (data->state).authhost.field_0x18 & 0xfd;
  (data->state).authproxy.field_0x18 = (data->state).authproxy.field_0x18 & 0xfd;
  Curl_dyn_reset(&(data->state).headerb);
  data_local._4_4_ = status;
  if (status == CURLE_OK) {
    if ((((premature) || (((ulong)conn_00->bits >> 0xe & 1) != 0)) ||
        ((data->set).connect_only != '\0')) ||
       (0 < (long)(((data->req).bytecount + (ulong)(data->req).headerbytecount) -
                  (ulong)(data->req).deductheadercount))) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf(data,"Empty reply from server");
      Curl_conncontrol(conn_00,2);
      data_local._4_4_ = CURLE_GOT_NOTHING;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http_done(struct Curl_easy *data,
                        CURLcode status, bool premature)
{
  struct connectdata *conn = data->conn;

  /* Clear multipass flag. If authentication is not done yet, then it will get
   * a chance to be set back to true when we output the next auth header */
  data->state.authhost.multipass = FALSE;
  data->state.authproxy.multipass = FALSE;

  Curl_dyn_reset(&data->state.headerb);
  Curl_hyper_done(data);

  if(status)
    return status;

  if(!premature && /* this check is pointless when DONE is called before the
                      entire operation is complete */
     !conn->bits.retry &&
     !data->set.connect_only &&
     (data->req.bytecount +
      data->req.headerbytecount -
      data->req.deductheadercount) <= 0) {
    /* If this connection is not simply closed to be retried, AND nothing was
       read from the HTTP server (that counts), this cannot be right so we
       return an error here */
    failf(data, "Empty reply from server");
    /* Mark it as closed to avoid the "left intact" message */
    streamclose(conn, "Empty reply from server");
    return CURLE_GOT_NOTHING;
  }

  return CURLE_OK;
}